

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

void __thiscall
pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>::operator=
          (accessor<pybind11::detail::accessor_policies::generic_item> *this,
          accessor<pybind11::detail::accessor_policies::generic_item> *value)

{
  handle obj;
  handle key;
  object *poVar1;
  object local_18;
  
  obj.m_ptr = (this->obj).m_ptr;
  key.m_ptr = (this->key).super_handle.m_ptr;
  poVar1 = get_cache(value);
  local_18.super_handle.m_ptr = (handle)(poVar1->super_handle).m_ptr;
  if (local_18.super_handle.m_ptr != (PyObject *)0x0) {
    ((PyObject *)local_18.super_handle.m_ptr)->ob_refcnt =
         ((PyObject *)local_18.super_handle.m_ptr)->ob_refcnt + 1;
  }
  accessor_policies::generic_item::set(obj,key,local_18.super_handle);
  object::~object(&local_18);
  return;
}

Assistant:

void operator=(T &&value) && {
        Policy::set(obj, key, object_or_cast(std::forward<T>(value)));
    }